

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrdemo_tools.cxx
# Opt level: O2

void __thiscall xrdemo_tools::process(xrdemo_tools *this,cl_parser *cl)

{
  ulong uVar1;
  uint8_t *puVar2;
  xr_envelope *pxVar3;
  bool bVar4;
  xr_file_system *this_00;
  xr_reader *this_01;
  xr_key *pxVar5;
  ulong uVar6;
  _Alloc_hider source;
  char *format;
  int iVar7;
  ulong uVar8;
  float _time;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_140;
  ulong local_130;
  string target;
  fmatrix xform;
  xr_obj_motion omotion;
  
  bVar4 = batch_helper::prepare_target_name(&this->super_batch_helper,cl);
  if (bVar4) {
    uVar1 = cl->m_num_params;
    for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
      source._M_p = cl->m_options[cl->m_argc + ~uVar6].name;
      target._M_dataplus._M_p = (pointer)&target.field_2;
      target._M_string_length = 0;
      target.field_2._M_local_buf[0] = '\0';
      batch_helper::make_target_name(&this->super_batch_helper,&target,source._M_p,".anm");
      xray_re::xr_obj_motion::xr_obj_motion(&omotion);
      this_00 = xray_re::xr_file_system::instance();
      this_01 = xray_re::xr_file_system::r_open(this_00,source._M_p);
      if (this_01 == (xr_reader *)0x0) {
LAB_00145f00:
        format = "can\'t load %s";
LAB_00145f07:
        xray_re::msg(format,source._M_p);
      }
      else {
        local_130 = xray_re::xr_reader::size(this_01);
        if (local_130 == 0 || (local_130 & 0x3f) != 0) {
          (*this_01->_vptr_xr_reader[1])(this_01);
          goto LAB_00145f00;
        }
        xray_re::xr_obj_motion::create_envelopes(&omotion);
        local_130 = local_130 >> 6;
        iVar7 = 0;
        for (uVar8 = 0; pxVar3 = omotion.m_envelopes[0], local_130 != uVar8; uVar8 = uVar8 + 1) {
          puVar2 = (this_01->field_2).m_p;
          xform.field_0._0_8_ = *(undefined8 *)puVar2;
          xform.field_0._8_8_ = *(undefined8 *)(puVar2 + 8);
          xform.field_0._16_8_ = *(undefined8 *)(puVar2 + 0x10);
          xform.field_0._24_8_ = *(undefined8 *)(puVar2 + 0x18);
          xform.field_0._32_8_ = *(undefined8 *)(puVar2 + 0x20);
          xform.field_0._40_8_ = *(undefined8 *)(puVar2 + 0x28);
          xform.field_0._48_8_ = *(undefined8 *)(puVar2 + 0x30);
          xform.field_0._56_8_ = *(undefined8 *)(puVar2 + 0x38);
          (this_01->field_2).m_p = puVar2 + 0x40;
          pxVar5 = (xr_key *)operator_new(0x28);
          _time = (float)(int)uVar8;
          xray_re::xr_key::xr_key(pxVar5,SHAPE_TCB,_time,xform.field_0.field_0._41);
          xray_re::xr_envelope::insert_key(pxVar3,pxVar5);
          pxVar3 = omotion.m_envelopes[1];
          pxVar5 = (xr_key *)operator_new(0x28);
          xray_re::xr_key::xr_key(pxVar5,SHAPE_TCB,_time,xform.field_0.field_0._42);
          xray_re::xr_envelope::insert_key(pxVar3,pxVar5);
          pxVar3 = omotion.m_envelopes[2];
          pxVar5 = (xr_key *)operator_new(0x28);
          xray_re::xr_key::xr_key(pxVar5,SHAPE_TCB,_time,xform.field_0.field_0._43);
          xray_re::xr_envelope::insert_key(pxVar3,pxVar5);
          xray_re::_matrix<float>::get_hpb(&xform,(_vector3<float> *)&local_140.field_0);
          pxVar3 = omotion.m_envelopes[4];
          local_140._0_8_ = 0;
          local_140.field_0.z = 0.0;
          pxVar5 = (xr_key *)operator_new(0x28);
          xray_re::xr_key::xr_key(pxVar5,SHAPE_TCB,_time,0.0);
          xray_re::xr_envelope::insert_key(pxVar3,pxVar5);
          pxVar3 = omotion.m_envelopes[3];
          pxVar5 = (xr_key *)operator_new(0x28);
          xray_re::xr_key::xr_key(pxVar5,SHAPE_TCB,_time,local_140.field_0.y);
          xray_re::xr_envelope::insert_key(pxVar3,pxVar5);
          pxVar3 = omotion.m_envelopes[5];
          pxVar5 = (xr_key *)operator_new(0x28);
          xray_re::xr_key::xr_key(pxVar5,SHAPE_TCB,_time,local_140.field_0.z);
          xray_re::xr_envelope::insert_key(pxVar3,pxVar5);
          iVar7 = iVar7 + 0x1e;
        }
        omotion.super_xr_motion.m_frame_start = 0;
        omotion.super_xr_motion.m_frame_end = iVar7;
        (*this_01->_vptr_xr_reader[1])(this_01);
        bVar4 = xray_re::xr_obj_motion::save_anm(&omotion,target._M_dataplus._M_p);
        if (!bVar4) {
          format = "can\'t save %s";
          source = target._M_dataplus;
          goto LAB_00145f07;
        }
      }
      xray_re::xr_obj_motion::~xr_obj_motion(&omotion);
      std::__cxx11::string::~string((string *)&target);
    }
  }
  return;
}

Assistant:

void xrdemo_tools::process(const cl_parser& cl)
{
	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		std::string target;
		make_target_name(target, source, ".anm");
		xr_obj_motion omotion;
		if (load_xrdemo(omotion, source)) {
			if (!omotion.save_anm(target.c_str()))
				msg("can't save %s", target.c_str());
		} else {
			msg("can't load %s", source);
		}
	}
}